

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestCustomOptions_Test::TestBody
          (ConvertDescriptorToTypeTest_TestCustomOptions_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  RepeatedPtrField<google::protobuf::Option> *pRVar3;
  char *message;
  Field *this_00;
  char *pcVar4;
  Descriptor *in_R8;
  char *in_R9;
  string_view url_prefix;
  string_view name;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  string_view local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  size_t local_118;
  Field *field;
  AssertHelper local_e8;
  Message local_e0;
  string_view local_d8 [2];
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  size_t local_98;
  undefined1 local_90 [8];
  Type type;
  ConvertDescriptorToTypeTest_TestCustomOptions_Test *this_local;
  
  type.field_0._104_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "type.googleapis.com");
  pDVar2 = proto2_unittest::TestMessageWithCustomOptions::GetDescriptor();
  url_prefix._M_str = (char *)pDVar2;
  url_prefix._M_len = local_98;
  ConvertDescriptorToType
            ((Type *)local_90,
             (util *)gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,url_prefix,in_R8);
  pRVar3 = Type::options((Type *)local_90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_d8,"proto2_unittest.message_opt1");
  pcVar4 = (char *)0xffffffc8;
  local_b1 = HasInt32Option(pRVar3,local_d8[0],-0x38);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&field,(internal *)local_b0,
               (AssertionResult *)
               "HasInt32Option(type.options(), \"proto2_unittest.message_opt1\", -56)","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    pcVar4 = (char *)0x2d1;
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2d1,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&field);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,"field1");
  name._M_str = pcVar4;
  name._M_len = local_118;
  this_00 = FindField((anon_unknown_0 *)local_90,
                      (Type *)gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,name);
  local_131 = this_00 != (Field *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_130,(AssertionResult *)0x1e0795f,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pRVar3 = Field::options(this_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,"proto2_unittest.field_opt1");
    local_181 = HasUInt64Option(pRVar3,local_198,0x20a75e12d);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)local_180,
                 (AssertionResult *)
                 "HasUInt64Option(field->options(), \"proto2_unittest.field_opt1\", 8765432109)",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x2d5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  Type::~Type((Type *)local_90);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestCustomOptions) {
  Type type = ConvertDescriptorToType(
      kUrlPrefix,
      *proto2_unittest::TestMessageWithCustomOptions::GetDescriptor());
  EXPECT_TRUE(
      HasInt32Option(type.options(), "proto2_unittest.message_opt1", -56));
  const Field* field = FindField(type, "field1");
  ASSERT_TRUE(field != nullptr);
  EXPECT_TRUE(HasUInt64Option(field->options(), "proto2_unittest.field_opt1",
                              8765432109));
}